

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_ret
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,int ret)

{
  char str [512];
  char acStack_228 [512];
  
  if ((ssl->conf != (mbedtls_ssl_config *)0x0) && (ret != -0x6900)) {
    if ((ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0) &&
       (level <= debug_threshold)) {
      snprintf(acStack_228,0x200,"%s() returned %d (-0x%04x)\n",text,ret,(ulong)(uint)-ret);
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,acStack_228);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_ret( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, int ret )
{
    char str[DEBUG_BUF_SIZE];

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    /*
     * With non-blocking I/O and examples that just retry immediately,
     * the logs would be quickly flooded with WANT_READ, so ignore that.
     * Don't ignore WANT_WRITE however, since is is usually rare.
     */
    if( ret == MBEDTLS_ERR_SSL_WANT_READ )
        return;

    mbedtls_snprintf( str, sizeof( str ), "%s() returned %d (-0x%04x)\n",
              text, ret, -ret );

    debug_send_line( ssl, level, file, line, str );
}